

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

vector<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_> * unicode_cpt_flags_array(void)

{
  bool bVar1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *puVar2;
  const_iterator ppVar3;
  reference pvVar4;
  reference pvVar5;
  const_iterator ppVar6;
  const_iterator prVar7;
  initializer_list<range_nfd> *in_RDI;
  range_nfd *range;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  initializer_list<range_nfd> *__range1_3;
  pair<unsigned_int,_unsigned_int> p_1;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> *__range1_2;
  pair<unsigned_int,_unsigned_int> p;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> *__range1_1;
  value_type_conflict2 cpt_1;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range1;
  uint32_t cpt;
  pair<unsigned_int,_unsigned_short> range_end;
  pair<unsigned_int,_unsigned_short> range_ini;
  size_t i;
  vector<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_> *cpt_flags;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this;
  initializer_list<range_nfd> *__a;
  unicode_cpt_flags *this_00;
  undefined1 *__n;
  vector<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_> *in_stack_ffffffffffffff40;
  const_iterator local_b0;
  const_iterator local_90;
  const_iterator local_70;
  _Node_iterator_base<unsigned_int,_false> local_58;
  _Node_iterator_base<unsigned_int,_false> local_50;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_48;
  value_type local_3e;
  uint local_3c;
  pair<unsigned_int,_unsigned_short> local_38;
  pair<unsigned_int,_unsigned_short> local_30;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_28;
  undefined1 local_d;
  unicode_cpt_flags local_c;
  undefined1 local_9;
  
  local_9 = 0;
  this_00 = &local_c;
  __a = in_RDI;
  unicode_cpt_flags::unicode_cpt_flags(this_00,1);
  __n = &local_d;
  std::allocator<unicode_cpt_flags>::allocator((allocator<unicode_cpt_flags> *)0x55a10d);
  std::vector<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_>::vector
            (in_stack_ffffffffffffff40,(size_type)__n,this_00,(allocator_type *)__a);
  std::allocator<unicode_cpt_flags>::~allocator((allocator<unicode_cpt_flags> *)0x55a135);
  local_28 = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)0x1;
  while (this = local_28,
        puVar2 = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)std::initializer_list<std::pair<unsigned_int,_unsigned_short>_>::size
                              (&unicode_ranges_flags), this < puVar2) {
    ppVar3 = std::initializer_list<std::pair<unsigned_int,_unsigned_short>_>::begin
                       (&unicode_ranges_flags);
    local_30 = ppVar3[(long)((long)&local_28[-1]._M_h._M_single_bucket + 7)];
    ppVar3 = std::initializer_list<std::pair<unsigned_int,_unsigned_short>_>::begin
                       (&unicode_ranges_flags);
    local_38 = ppVar3[(long)local_28];
    for (local_3c = local_30.first; local_3c < local_38.first; local_3c = local_3c + 1) {
      unicode_cpt_flags::unicode_cpt_flags(&local_3e,local_30.second);
      pvVar4 = std::vector<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_>::operator[]
                         ((vector<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_> *)__a,
                          (ulong)local_3c);
      *pvVar4 = local_3e;
    }
    local_28 = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)((long)&(local_28->_M_h)._M_buckets + 1);
  }
  local_48 = &unicode_set_whitespace;
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::begin(this);
  local_58._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(this);
  while (bVar1 = std::__detail::operator!=(&local_50,&local_58), bVar1) {
    pvVar5 = std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator*
                       ((_Node_const_iterator<unsigned_int,_true,_false> *)0x55a2da);
    pvVar4 = std::vector<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_>::operator[]
                       ((vector<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_> *)__a,
                        (ulong)*pvVar5);
    *pvVar4 = (value_type)((ushort)*pvVar4 & 0xfeff | 0x100);
    std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++
              ((_Node_const_iterator<unsigned_int,_true,_false> *)in_RDI);
  }
  local_70 = std::initializer_list<std::pair<unsigned_int,_unsigned_int>_>::begin
                       (&unicode_map_lowercase);
  ppVar6 = std::initializer_list<std::pair<unsigned_int,_unsigned_int>_>::end
                     ((initializer_list<std::pair<unsigned_int,_unsigned_int>_> *)in_RDI);
  for (; local_70 != ppVar6; local_70 = local_70 + 1) {
    pvVar4 = std::vector<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_>::operator[]
                       ((vector<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_> *)__a,
                        (ulong)*local_70 >> 0x20);
    *pvVar4 = (value_type)((ushort)*pvVar4 & 0xfdff | 0x200);
  }
  local_90 = std::initializer_list<std::pair<unsigned_int,_unsigned_int>_>::begin
                       (&unicode_map_uppercase);
  ppVar6 = std::initializer_list<std::pair<unsigned_int,_unsigned_int>_>::end
                     ((initializer_list<std::pair<unsigned_int,_unsigned_int>_> *)in_RDI);
  for (; local_90 != ppVar6; local_90 = local_90 + 1) {
    pvVar4 = std::vector<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_>::operator[]
                       ((vector<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_> *)__a,
                        (ulong)*local_90 >> 0x20);
    *pvVar4 = (value_type)((ushort)*pvVar4 & 0xfbff | 0x400);
  }
  local_b0 = std::initializer_list<range_nfd>::begin(&unicode_ranges_nfd);
  prVar7 = std::initializer_list<range_nfd>::end(in_RDI);
  for (; local_b0 != prVar7; local_b0 = local_b0 + 1) {
    pvVar4 = std::vector<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_>::operator[]
                       ((vector<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_> *)__a,
                        (ulong)local_b0->nfd);
    *pvVar4 = (value_type)((ushort)*pvVar4 & 0xf7ff | 0x800);
  }
  return (vector<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_> *)in_RDI;
}

Assistant:

static std::vector<unicode_cpt_flags> unicode_cpt_flags_array() {
    std::vector<unicode_cpt_flags> cpt_flags(MAX_CODEPOINTS, unicode_cpt_flags::UNDEFINED);

    assert (unicode_ranges_flags.begin()[0].first == 0);
    assert (unicode_ranges_flags.begin()[unicode_ranges_flags.size()-1].first == MAX_CODEPOINTS);
    for (size_t i = 1; i < unicode_ranges_flags.size(); ++i) {
        const auto range_ini = unicode_ranges_flags.begin()[i-1];  // codepoint_ini, flags
        const auto range_end = unicode_ranges_flags.begin()[i];    // codepoint_end, flags
        for (uint32_t cpt = range_ini.first; cpt < range_end.first; ++cpt) {
            cpt_flags[cpt] = range_ini.second;
        }
    }

    for (auto cpt : unicode_set_whitespace) {
        cpt_flags[cpt].is_whitespace = true;
    }

    for (auto p : unicode_map_lowercase) {
        cpt_flags[p.second].is_lowercase = true;
    }

    for (auto p : unicode_map_uppercase) {
        cpt_flags[p.second].is_uppercase = true;
    }

    for (auto &range : unicode_ranges_nfd) {  // start, last, nfd
        cpt_flags[range.nfd].is_nfd = true;
    }

    return cpt_flags;
}